

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O1

FONScontext * fonsCreateInternal(FONSparams *params)

{
  int iVar1;
  _func_int_void_ptr_int_int *p_Var2;
  void *pvVar3;
  _func_int_void_ptr_int_int *p_Var4;
  _func_void_void_ptr_int_ptr_uchar_ptr *p_Var5;
  _func_void_void_ptr_float_ptr_float_ptr_uint_ptr_int *p_Var6;
  _func_void_void_ptr *p_Var7;
  uchar uVar8;
  undefined7 uVar9;
  int iVar10;
  FONScontext *stash;
  uchar *puVar11;
  FONSatlas *atlas;
  FONSatlasNode *__s;
  FONSfont **ppFVar12;
  long lVar13;
  int h;
  int w;
  
  stash = (FONScontext *)malloc(0x5280);
  if (stash == (FONScontext *)0x0) goto LAB_0046f50f;
  memset(&stash->itw,0,0x5240);
  iVar10 = params->height;
  uVar8 = params->flags;
  uVar9 = *(undefined7 *)&params->field_0x9;
  pvVar3 = params->userPtr;
  p_Var2 = params->renderCreate;
  p_Var4 = params->renderResize;
  p_Var5 = params->renderUpdate;
  p_Var6 = params->renderDraw;
  p_Var7 = params->renderDelete;
  (stash->params).width = params->width;
  (stash->params).height = iVar10;
  (stash->params).flags = uVar8;
  *(undefined7 *)&(stash->params).field_0x9 = uVar9;
  (stash->params).userPtr = pvVar3;
  (stash->params).renderCreate = p_Var2;
  (stash->params).renderResize = p_Var4;
  (stash->params).renderUpdate = p_Var5;
  (stash->params).renderDraw = p_Var6;
  (stash->params).renderDelete = p_Var7;
  puVar11 = (uchar *)malloc(96000);
  stash->scratch = puVar11;
  if ((puVar11 == (uchar *)0x0) ||
     ((p_Var2 = (stash->params).renderCreate, p_Var2 != (_func_int_void_ptr_int_int *)0x0 &&
      (iVar10 = (*p_Var2)((stash->params).userPtr,(stash->params).width,(stash->params).height),
      iVar10 == 0)))) goto LAB_0046f50f;
  iVar10 = (stash->params).width;
  iVar1 = (stash->params).height;
  atlas = (FONSatlas *)malloc(0x18);
  if (atlas == (FONSatlas *)0x0) {
LAB_0046f422:
    atlas = (FONSatlas *)0x0;
  }
  else {
    atlas->width = 0;
    atlas->height = 0;
    atlas->nodes = (FONSatlasNode *)0x0;
    atlas->nnodes = 0;
    atlas->cnodes = 0;
    atlas->width = iVar10;
    atlas->height = iVar1;
    __s = (FONSatlasNode *)malloc(0x600);
    atlas->nodes = __s;
    if (__s == (FONSatlasNode *)0x0) {
      fons__deleteAtlas(atlas);
      goto LAB_0046f422;
    }
    memset(__s,0,0x600);
    atlas->nnodes = 0;
    atlas->cnodes = 0x100;
    __s->x = 0;
    __s->y = 0;
    __s->width = (short)iVar10;
    atlas->nnodes = 1;
  }
  stash->atlas = atlas;
  if (atlas != (FONSatlas *)0x0) {
    ppFVar12 = (FONSfont **)malloc(0x20);
    stash->fonts = ppFVar12;
    if (ppFVar12 != (FONSfont **)0x0) {
      ppFVar12[2] = (FONSfont *)0x0;
      ppFVar12[3] = (FONSfont *)0x0;
      *ppFVar12 = (FONSfont *)0x0;
      ppFVar12[1] = (FONSfont *)0x0;
      stash->cfonts = 4;
      stash->nfonts = 0;
      iVar10 = (stash->params).width;
      iVar1 = (stash->params).height;
      stash->itw = 1.0 / (float)iVar10;
      stash->ith = 1.0 / (float)iVar1;
      puVar11 = (uchar *)malloc((long)(iVar1 * iVar10));
      stash->texData = puVar11;
      if (puVar11 != (uchar *)0x0) {
        w = 0;
        memset(puVar11,0,(long)(iVar1 * iVar10));
        stash->dirtyRect[0] = iVar10;
        stash->dirtyRect[1] = iVar1;
        stash->dirtyRect[2] = 0;
        stash->dirtyRect[3] = 0;
        fons__addWhiteRect(stash,w,h);
        fonsPushState(stash);
        lVar13 = (long)stash->nstates;
        stash->states[lVar13 + -1].color = 0xffffffff;
        stash->states[lVar13 + -1].font = 0;
        stash->states[lVar13 + -1].blur = 0.0;
        stash->states[lVar13 + -1].spacing = 0.0;
        stash->states[lVar13 + -1].align = 0x41;
        stash->states[lVar13 + -1].size = 12.0;
        return stash;
      }
    }
  }
LAB_0046f50f:
  fonsDeleteInternal(stash);
  return (FONScontext *)0x0;
}

Assistant:

FONScontext* fonsCreateInternal(FONSparams* params)
{
	FONScontext* stash = NULL;

	// Allocate memory for the font stash.
	stash = (FONScontext*)malloc(sizeof(FONScontext));
	if (stash == NULL) goto error;
	memset(stash, 0, sizeof(FONScontext));

	stash->params = *params;

	// Allocate scratch buffer.
	stash->scratch = (unsigned char*)malloc(FONS_SCRATCH_BUF_SIZE);
	if (stash->scratch == NULL) goto error;

	// Initialize implementation library
	if (!fons__tt_init(stash)) goto error;

	if (stash->params.renderCreate != NULL) {
		if (stash->params.renderCreate(stash->params.userPtr, stash->params.width, stash->params.height) == 0)
			goto error;
	}

	stash->atlas = fons__allocAtlas(stash->params.width, stash->params.height, FONS_INIT_ATLAS_NODES);
	if (stash->atlas == NULL) goto error;

	// Allocate space for fonts.
	stash->fonts = (FONSfont**)malloc(sizeof(FONSfont*) * FONS_INIT_FONTS);
	if (stash->fonts == NULL) goto error;
	memset(stash->fonts, 0, sizeof(FONSfont*) * FONS_INIT_FONTS);
	stash->cfonts = FONS_INIT_FONTS;
	stash->nfonts = 0;

	// Create texture for the cache.
	stash->itw = 1.0f/stash->params.width;
	stash->ith = 1.0f/stash->params.height;
	stash->texData = (unsigned char*)malloc(stash->params.width * stash->params.height);
	if (stash->texData == NULL) goto error;
	memset(stash->texData, 0, stash->params.width * stash->params.height);

	stash->dirtyRect[0] = stash->params.width;
	stash->dirtyRect[1] = stash->params.height;
	stash->dirtyRect[2] = 0;
	stash->dirtyRect[3] = 0;

	// Add white rect at 0,0 for debug drawing.
	fons__addWhiteRect(stash, 2,2);

	fonsPushState(stash);
	fonsClearState(stash);

	return stash;

error:
	fonsDeleteInternal(stash);
	return NULL;
}